

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O2

int __thiscall MetaCommand::GetValueAsInt(MetaCommand *this,Option *option,string *fieldName)

{
  __type _Var1;
  int iVar2;
  pointer __lhs;
  string fieldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::__cxx11::string::string((string *)&bStack_38,(string *)fieldName);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&bStack_38);
  }
  __lhs = (option->fields).
          super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl.
          super__Vector_impl_data._M_start;
  do {
    if (__lhs == (option->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish) {
      iVar2 = 0;
LAB_001167f8:
      std::__cxx11::string::~string((string *)&bStack_38);
      return iVar2;
    }
    _Var1 = std::operator==(&__lhs->name,&bStack_38);
    if (_Var1) {
      iVar2 = atoi((__lhs->value)._M_dataplus._M_p);
      goto LAB_001167f8;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

int MetaCommand::GetValueAsInt(Option option,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = option.name;
  }

  METAIO_STL::vector<Field>::const_iterator itField = option.fields.begin();
  while(itField != option.fields.end())
    {
    if((*itField).name == fieldname)
      {
      return atoi((*itField).value.c_str());
      }
    ++itField;
    }
  return 0;
}